

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkDirectoriesCommand.cxx
# Opt level: O2

void __thiscall cmLinkDirectoriesCommand::AddLinkDir(cmLinkDirectoriesCommand *this,string *dir)

{
  cmMakefile *pcVar1;
  bool bVar2;
  PolicyStatus PVar3;
  ostream *poVar4;
  char *pcVar5;
  PolicyID id;
  allocator local_1c9;
  string tmp;
  string unixPath;
  ostringstream e;
  
  std::__cxx11::string::string((string *)&unixPath,(string *)dir);
  cmsys::SystemTools::ConvertToUnixSlashes(&unixPath);
  bVar2 = cmsys::SystemTools::FileIsFullPath(unixPath._M_dataplus._M_p);
  if (bVar2) goto LAB_0033cfb5;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
  poVar4 = std::operator<<((ostream *)&e,"This command specifies the relative path\n");
  poVar4 = std::operator<<(poVar4,"  ");
  poVar4 = std::operator<<(poVar4,(string *)&unixPath);
  poVar4 = std::operator<<(poVar4,"\n");
  std::operator<<(poVar4,"as a link directory.\n");
  PVar3 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0015);
  if (PVar3 - REQUIRED_IF_USED < 2) {
    cmPolicies::GetRequiredPolicyError_abi_cxx11_(&tmp,(cmPolicies *)0xf,id);
    std::operator<<((ostream *)&e,(string *)&tmp);
    std::__cxx11::string::~string((string *)&tmp);
    pcVar1 = (this->super_cmCommand).Makefile;
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&tmp);
    std::__cxx11::string::~string((string *)&tmp);
LAB_0033cf0d:
    pcVar5 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
    std::__cxx11::string::string((string *)&tmp,pcVar5,&local_1c9);
    std::__cxx11::string::append((char *)&tmp);
    std::__cxx11::string::append((string *)&tmp);
    std::__cxx11::string::_M_assign((string *)&unixPath);
LAB_0033cfa1:
    std::__cxx11::string::~string((string *)&tmp);
  }
  else {
    if (PVar3 == WARN) {
      cmPolicies::GetPolicyWarning_abi_cxx11_(&tmp,(cmPolicies *)0xf,id);
      std::operator<<((ostream *)&e,(string *)&tmp);
      std::__cxx11::string::~string((string *)&tmp);
      pcVar1 = (this->super_cmCommand).Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&tmp);
      goto LAB_0033cfa1;
    }
    if (PVar3 == NEW) goto LAB_0033cf0d;
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
LAB_0033cfb5:
  pcVar1 = (this->super_cmCommand).Makefile;
  std::__cxx11::string::string((string *)&e,"LINK_DIRECTORIES",(allocator *)&tmp);
  cmMakefile::AppendProperty(pcVar1,(string *)&e,unixPath._M_dataplus._M_p,false);
  std::__cxx11::string::~string((string *)&e);
  std::__cxx11::string::~string((string *)&unixPath);
  return;
}

Assistant:

void cmLinkDirectoriesCommand::AddLinkDir(std::string const& dir)
{
  std::string unixPath = dir;
  cmSystemTools::ConvertToUnixSlashes(unixPath);
  if (!cmSystemTools::FileIsFullPath(unixPath.c_str())) {
    bool convertToAbsolute = false;
    std::ostringstream e;
    /* clang-format off */
    e << "This command specifies the relative path\n"
      << "  " << unixPath << "\n"
      << "as a link directory.\n";
    /* clang-format on */
    switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0015)) {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0015);
        this->Makefile->IssueMessage(cmake::AUTHOR_WARNING, e.str());
      case cmPolicies::OLD:
        // OLD behavior does not convert
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        e << cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0015);
        this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
        CM_FALLTHROUGH;
      case cmPolicies::NEW:
        // NEW behavior converts
        convertToAbsolute = true;
        break;
    }
    if (convertToAbsolute) {
      std::string tmp = this->Makefile->GetCurrentSourceDirectory();
      tmp += "/";
      tmp += unixPath;
      unixPath = tmp;
    }
  }
  this->Makefile->AppendProperty("LINK_DIRECTORIES", unixPath.c_str());
}